

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

PtrTokenOrSyntax * __thiscall
slang::syntax::NamedParamAssignmentSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,NamedParamAssignmentSyntax *this,size_t index)

{
  __index_type *p_Var1;
  
  switch(this) {
  case (NamedParamAssignmentSyntax *)0x0:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[1].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (NamedParamAssignmentSyntax *)0x1:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[2].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (NamedParamAssignmentSyntax *)0x2:
    p_Var1 = (__index_type *)
             ((long)&__return_storage_ptr__[3].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (NamedParamAssignmentSyntax *)0x3:
    return *(PtrTokenOrSyntax **)
            ((long)&__return_storage_ptr__[4].
                    super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                    super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
            + 8);
  case (NamedParamAssignmentSyntax *)0x4:
    p_Var1 = (__index_type *)(__return_storage_ptr__ + 5);
    break;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return (PtrTokenOrSyntax *)p_Var1;
}

Assistant:

PtrTokenOrSyntax NamedParamAssignmentSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &dot;
        case 1: return &name;
        case 2: return &openParen;
        case 3: return expr;
        case 4: return &closeParen;
        default: return nullptr;
    }
}